

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

float Abc_NtkComputeNodeDeparture(Abc_Obj_t *pObj,float Slew)

{
  float *pfVar1;
  Abc_Obj_t *pNode;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  iVar3 = pObj->Id;
  if ((-1 < (long)iVar3) &&
     (lVar6 = *(long *)((long)pObj->pNtk->pBSMan + 0x50), iVar3 < *(int *)(lVar6 + 4))) {
    fVar7 = *(float *)(*(long *)(lVar6 + 8) + (long)iVar3 * 4);
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      __assert_fail("Bus_SclObjDept(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBufSize.c"
                    ,0xb6,"float Abc_NtkComputeNodeDeparture(Abc_Obj_t *, float)");
    }
    if (0 < (pObj->vFanouts).nSize) {
      lVar6 = 0;
      do {
        pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
        if ((((pNode->pNtk->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7))
            && ((pNode->vFanins).nSize == 1)) && ((pNode->field_5).pData == (void *)0x0)) {
          iVar3 = pNode->Id;
          if (((long)iVar3 < 0) ||
             (lVar4 = *(long *)((long)pNode->pNtk->pBSMan + 0x50), *(int *)(lVar4 + 4) <= iVar3))
          goto LAB_004562d0;
          lVar5 = (long)pObj->Id;
          if ((lVar5 < 0) ||
             (lVar2 = *(long *)((long)pObj->pNtk->pBSMan + 0x50), *(int *)(lVar2 + 4) <= pObj->Id))
          {
LAB_004562b1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x173,"float *Vec_FltEntryP(Vec_Flt_t *, int)");
          }
          fVar7 = *(float *)(*(long *)(lVar4 + 8) + (long)iVar3 * 4);
          lVar4 = *(long *)(lVar2 + 8);
          pfVar1 = (float *)(lVar4 + lVar5 * 4);
          if (*pfVar1 <= fVar7 && fVar7 != *pfVar1) {
            *(float *)(lVar4 + lVar5 * 4) = fVar7;
          }
        }
        else if ((*(uint *)&pNode->field_0x14 & 0xf) - 5 < 0xfffffffe) {
          iVar3 = Abc_NodeFindFanin(pNode,pObj);
          fVar7 = Abc_NtkComputeEdgeDept(pNode,iVar3,Slew);
          lVar4 = (long)pObj->Id;
          if ((lVar4 < 0) ||
             (lVar5 = *(long *)((long)pObj->pNtk->pBSMan + 0x50), *(int *)(lVar5 + 4) <= pObj->Id))
          goto LAB_004562b1;
          lVar5 = *(long *)(lVar5 + 8);
          pfVar1 = (float *)(lVar5 + lVar4 * 4);
          if (*pfVar1 <= fVar7 && fVar7 != *pfVar1) {
            *(float *)(lVar5 + lVar4 * 4) = fVar7;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (pObj->vFanouts).nSize);
    }
    iVar3 = pObj->Id;
    if ((-1 < (long)iVar3) &&
       (lVar6 = *(long *)((long)pObj->pNtk->pBSMan + 0x50), iVar3 < *(int *)(lVar6 + 4))) {
      return *(float *)(*(long *)(lVar6 + 8) + (long)iVar3 * 4);
    }
  }
LAB_004562d0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

float Abc_NtkComputeNodeDeparture( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Bus_SclObjDept(pObj) == 0 );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
            Bus_SclObjUpdateDept( pObj, Bus_SclObjDept(pFanout) );
        else if ( !Abc_ObjIsCo(pFanout) ) // add required times here
            Bus_SclObjUpdateDept( pObj, Abc_NtkComputeEdgeDept(pFanout, Abc_NodeFindFanin(pFanout, pObj), Slew) );
    }
    return Bus_SclObjDept( pObj );
}